

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

TypedValue * ToWabtValue(TypedValue *__return_storage_ptr__,wasm_val_t *value)

{
  byte bVar1;
  ValueType VVar2;
  anon_union_8_5_30786955_for_of *paVar3;
  anon_union_8_5_30786955_for_of aVar4;
  TypedValue *this;
  wasm_val_t *pwVar5;
  Store *this_00;
  RefPtr<wabt::interp::Trap> RStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_80;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> vStack_60;
  TypedValue *pTStack_40;
  
  pwVar5 = value;
  VVar2 = ToWabtValueType(value->kind);
  (__return_storage_ptr__->type).enum_ = VVar2.enum_;
  bVar1 = value->kind;
  switch(bVar1) {
  case 0:
    (__return_storage_ptr__->value).i32_ = (value->of).i32;
    break;
  case 1:
    aVar4 = value->of;
    goto LAB_0019c8b9;
  case 2:
    (__return_storage_ptr__->value).i32_ = (value->of).i32;
    break;
  case 3:
    (__return_storage_ptr__->value).i64_ = (u64)value->of;
    break;
  default:
    if (1 < bVar1 - 0x80) {
      this_00 = (Store *)(ulong)bVar1;
      ToWabtValue();
      pTStack_40 = __return_storage_ptr__;
      this = (TypedValue *)operator_new(0x18);
      bStack_80._M_dataplus._M_p = (pointer)&bStack_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&bStack_80,(pwVar5->of).ref,
                 (long)&(((pwVar5->of).ref)->I).obj_ + *(long *)pwVar5);
      vStack_60.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_60.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_60.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      wabt::interp::Store::
      Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                (&RStack_a0,this_00,this_00,&bStack_80,&vStack_60);
      wasm_trap_t::wasm_trap_t((wasm_trap_t *)this,&RStack_a0);
      if (RStack_a0.obj_ != (Trap *)0x0) {
        wabt::interp::Store::DeleteRoot(RStack_a0.store_,RStack_a0.root_index_);
        RStack_a0.obj_ = (Trap *)0x0;
        RStack_a0.store_ = (Store *)0x0;
        RStack_a0.root_index_ = 0;
      }
      if (vStack_60.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_60.
                        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)bStack_80._M_dataplus._M_p != &bStack_80.field_2) {
        operator_delete(bStack_80._M_dataplus._M_p);
      }
      return this;
    }
    if ((value->of).ref == (wasm_ref_t *)0x0) {
      paVar3 = (anon_union_8_5_30786955_for_of *)&wabt::interp::Ref::Null;
    }
    else {
      paVar3 = (anon_union_8_5_30786955_for_of *)&((((value->of).ref)->I).obj_)->self_;
    }
    aVar4 = *paVar3;
LAB_0019c8b9:
    (__return_storage_ptr__->value).i64_ = (u64)aVar4;
  }
  ToWabtValue();
  return __return_storage_ptr__;
}

Assistant:

static TypedValue ToWabtValue(const wasm_val_t& value) {
  TypedValue out;
  out.type = ToWabtValueType(value.kind);
  switch (value.kind) {
    case WASM_I32:
      out.value.Set(value.of.i32);
      break;
    case WASM_I64:
      out.value.Set(value.of.i64);
      break;
    case WASM_F32:
      out.value.Set(value.of.f32);
      break;
    case WASM_F64:
      out.value.Set(value.of.f64);
      break;
    case WASM_ANYREF:
    case WASM_FUNCREF:
      out.value.Set(value.of.ref ? value.of.ref->I->self() : Ref::Null);
      break;
    default:
      TRACE("unexpected wasm type: %d", value.kind);
      assert(false);
  }
  TRACE("-> %s", TypedValueToString(out).c_str());
  return out;
}